

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::neverReturn(TestMoreStuffImpl *this,NeverReturnContext context)

{
  Promise<void> promise;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a8;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  local_a0;
  undefined1 local_98 [24];
  undefined1 local_80 [40];
  Reader local_58;
  Maybe<capnp::MessageSize> local_28;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)local_98);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getParams(&local_58,&local_a0);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams::Reader::getCap
            ((Client *)local_80,&local_58);
  kj::Promise<void>::attach<capnproto_test::capnp::test::TestInterface::Client>
            ((Promise<void> *)&local_a8,(Client *)local_98);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_80 + 8));
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_98);
  local_28.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getResults((Builder *)local_80,&local_a0,&local_28);
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  ::getParams(&local_58,&local_a0);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams::Reader::getCap
            ((Client *)local_98,&local_58);
  capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults::Builder::setCapCopy
            ((Builder *)local_80,(Client *)local_98);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_98 + 8));
  *(PromiseNode **)&this->super_Server = local_a8.ptr;
  local_a8.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a8);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::neverReturn(NeverReturnContext context) {
  ++callCount;

  // Attach `cap` to the promise to make sure it is released.
  auto promise = kj::Promise<void>(kj::NEVER_DONE).attach(context.getParams().getCap());

  // Also attach `cap` to the result struct to make sure that is released.
  context.getResults().setCapCopy(context.getParams().getCap());

  return kj::mv(promise);
}